

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_open(archive_write_filter *f)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  uLong uVar6;
  time_t tVar7;
  time_t t;
  size_t bpb;
  size_t bs;
  int ret;
  private_data_conflict6 *data;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  if (*(long *)(piVar1 + 0x20) == 0) {
    bpb = 0x10000;
    sVar2 = bpb;
    if (f->archive->magic == 0xb0c5c0de) {
      iVar3 = archive_write_get_bytes_per_block(f->archive);
      uVar4 = (ulong)iVar3;
      sVar2 = uVar4;
      if ((uVar4 < 0x10001) && (sVar2 = bpb, uVar4 != 0)) {
        sVar2 = 0x10000 - 0x10000U % uVar4;
      }
    }
    bpb = sVar2;
    *(size_t *)(piVar1 + 0x22) = bpb;
    pvVar5 = malloc(*(size_t *)(piVar1 + 0x22));
    *(void **)(piVar1 + 0x20) = pvVar5;
    if (*(long *)(piVar1 + 0x20) == 0) {
      archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
      return -0x1e;
    }
  }
  uVar6 = cm_zlib_z_crc32(0,(uchar *)0x0,0);
  *(uLong *)(piVar1 + 0x24) = uVar6;
  *(undefined8 *)(piVar1 + 8) = *(undefined8 *)(piVar1 + 0x20);
  piVar1[10] = (int)*(undefined8 *)(piVar1 + 0x22);
  **(undefined1 **)(piVar1 + 0x20) = 0x1f;
  *(undefined1 *)(*(long *)(piVar1 + 0x20) + 1) = 0x8b;
  *(undefined1 *)(*(long *)(piVar1 + 0x20) + 2) = 8;
  *(undefined1 *)(*(long *)(piVar1 + 0x20) + 3) = 0;
  if (piVar1[1] < 0) {
    memset((void *)(*(long *)(piVar1 + 0x20) + 4),0,4);
  }
  else {
    tVar7 = time((time_t *)0x0);
    *(char *)(*(long *)(piVar1 + 0x20) + 4) = (char)tVar7;
    *(char *)(*(long *)(piVar1 + 0x20) + 5) = (char)((ulong)tVar7 >> 8);
    *(char *)(*(long *)(piVar1 + 0x20) + 6) = (char)((ulong)tVar7 >> 0x10);
    *(char *)(*(long *)(piVar1 + 0x20) + 7) = (char)((ulong)tVar7 >> 0x18);
  }
  if (*piVar1 == 9) {
    *(undefined1 *)(*(long *)(piVar1 + 0x20) + 8) = 2;
  }
  else if (*piVar1 == 1) {
    *(undefined1 *)(*(long *)(piVar1 + 0x20) + 8) = 4;
  }
  else {
    *(undefined1 *)(*(long *)(piVar1 + 0x20) + 8) = 0;
  }
  *(undefined1 *)(*(long *)(piVar1 + 0x20) + 9) = 3;
  *(long *)(piVar1 + 8) = *(long *)(piVar1 + 8) + 10;
  piVar1[10] = piVar1[10] + -10;
  f->write = archive_compressor_gzip_write;
  iVar3 = cm_zlib_deflateInit2_((z_streamp)(piVar1 + 2),*piVar1,8,-0xf,8,0,"1.2.12",0x70);
  if (iVar3 == 0) {
    f->data = piVar1;
    f_local._4_4_ = 0;
  }
  else {
    archive_set_error(f->archive,-1,"Internal error initializing compression library");
    if (iVar3 == -6) {
      archive_set_error(f->archive,-1,
                        "Internal error initializing compression library: invalid library version");
    }
    else if (iVar3 == -4) {
      archive_set_error(f->archive,0xc,"Internal error initializing compression library");
    }
    else if (iVar3 == -2) {
      archive_set_error(f->archive,-1,
                        "Internal error initializing compression library: invalid setup parameter");
    }
    f_local._4_4_ = -0x1e;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_gzip_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of
			 * the of bytes per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (unsigned char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	data->crc = crc32(0L, NULL, 0);
	data->stream.next_out = data->compressed;
	data->stream.avail_out = (uInt)data->compressed_buffer_size;

	/* Prime output buffer with a gzip header. */
	data->compressed[0] = 0x1f; /* GZip signature bytes */
	data->compressed[1] = 0x8b;
	data->compressed[2] = 0x08; /* "Deflate" compression */
	data->compressed[3] = 0; /* No options */
	if (data->timestamp >= 0) {
		time_t t = time(NULL);
		data->compressed[4] = (uint8_t)(t)&0xff;  /* Timestamp */
		data->compressed[5] = (uint8_t)(t>>8)&0xff;
		data->compressed[6] = (uint8_t)(t>>16)&0xff;
		data->compressed[7] = (uint8_t)(t>>24)&0xff;
	} else
		memset(&data->compressed[4], 0, 4);
    if (data->compression_level == 9)
	    data->compressed[8] = 2;
    else if(data->compression_level == 1)
	    data->compressed[8] = 4;
    else
	    data->compressed[8] = 0;
	data->compressed[9] = 3; /* OS=Unix */
	data->stream.next_out += 10;
	data->stream.avail_out -= 10;

	f->write = archive_compressor_gzip_write;

	/* Initialize compression library. */
	ret = deflateInit2(&(data->stream),
	    data->compression_level,
	    Z_DEFLATED,
	    -15 /* < 0 to suppress zlib header */,
	    8,
	    Z_DEFAULT_STRATEGY);

	if (ret == Z_OK) {
		f->data = data;
		return (ARCHIVE_OK);
	}

	/* Library setup failed: clean up. */
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC, "Internal error "
	    "initializing compression library");

	/* Override the error message if we know what really went wrong. */
	switch (ret) {
	case Z_STREAM_ERROR:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing "
		    "compression library: invalid setup parameter");
		break;
	case Z_MEM_ERROR:
		archive_set_error(f->archive, ENOMEM,
		    "Internal error initializing compression library");
		break;
	case Z_VERSION_ERROR:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing "
		    "compression library: invalid library version");
		break;
	}

	return (ARCHIVE_FATAL);
}